

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(string *platform)

{
  int iVar1;
  const_iterator cVar2;
  long *plVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_82;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  if (PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
      supportedPlatforms_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                                 supportedPlatforms_abi_cxx11_);
    if (iVar1 != 0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Windows","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Linux","");
      plVar3 = local_30;
      local_40[0] = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Darwin","");
      __l._M_len = 3;
      __l._M_array = &local_80;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
             supportedPlatforms_abi_cxx11_,__l,&local_81,&local_82);
      lVar4 = -0x60;
      do {
        if (plVar3 != (long *)plVar3[-2]) {
          operator_delete((long *)plVar3[-2],*plVar3 + 1);
        }
        plVar3 = plVar3 + -4;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                           supportedPlatforms_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
                  supportedPlatforms_abi_cxx11_._M_t,platform);
  return (_Rb_tree_header *)cVar2._M_node !=
         &PlatformSupportsRuntimeDependencies(std::__cxx11::string_const&)::
          supportedPlatforms_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
  const std::string& platform)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  return supportedPlatforms.count(platform);
}